

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

ssize_t rw::Texture::read(int __fd,void *__buf,size_t __nbytes)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  long lVar3;
  Texture *t;
  Raster *pRVar4;
  undefined4 in_register_0000003c;
  TexDictionary *this;
  
  lVar3 = (*(code *)findCB)();
  if (lVar3 != 0) {
    *(int *)(lVar3 + 100) = *(int *)(lVar3 + 100) + 1;
    return lVar3;
  }
  lVar3 = (long)textureModuleOffset;
  if (*(int *)(engine + 0x10 + lVar3) != 0) {
    t = (Texture *)(*(code *)readCB)((char *)CONCAT44(in_register_0000003c,__fd),__buf);
    if (t != (Texture *)0x0) goto LAB_0010e0ea;
    lVar3 = (long)textureModuleOffset;
  }
  if (*(int *)(engine + 0x14 + lVar3) == 0) {
    return 0;
  }
  t = create((Raster *)0x0);
  if (t == (Texture *)0x0) {
    return 0;
  }
  strncpy(t->name,(char *)CONCAT44(in_register_0000003c,__fd),0x20);
  if (__buf != (void *)0x0) {
    strncpy(t->mask,(char *)__buf,0x20);
  }
  pRVar4 = Raster::create(0,0,0,0x80,0);
  t->raster = pRVar4;
LAB_0010e0ea:
  lVar3 = (long)textureModuleOffset;
  this = *(TexDictionary **)(engine + 8 + lVar3);
  if (this != (TexDictionary *)0x0) {
    if (t->dict != (TexDictionary *)0x0) {
      pLVar1 = (t->inDict).next;
      pLVar2 = (t->inDict).prev;
      pLVar2->next = pLVar1;
      pLVar1->prev = pLVar2;
      this = *(TexDictionary **)(engine + 8 + lVar3);
    }
    TexDictionary::add(this,t);
  }
  return (ssize_t)t;
}

Assistant:

Texture*
Texture::read(const char *name, const char *mask)
{
	(void)mask;
	Raster *raster = nil;
	Texture *tex;

	if(tex = Texture::findCB(name), tex){
		tex->addRef();
		return tex;
	}
	if(TEXTUREGLOBAL(loadTextures)){
		tex = Texture::readCB(name, mask);
		if(tex == nil)
			goto dummytex;
	}else dummytex: if(TEXTUREGLOBAL(makeDummies)){
//printf("missing texture %s %s\n", name ? name : "", mask ? mask : "");
		tex = Texture::create(nil);
		if(tex == nil)
			return nil;
		strncpy(tex->name, name, 32);
		if(mask)
			strncpy(tex->mask, mask, 32);
		raster = Raster::create(0, 0, 0, Raster::DONTALLOCATE);
		tex->raster = raster;
	}
	if(tex && TEXTUREGLOBAL(currentTexDict)){
		if(tex->dict)
			tex->inDict.remove();
		TEXTUREGLOBAL(currentTexDict)->add(tex);
	}
	return tex;
}